

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

SourceFunctionNode __thiscall CmdLineArgsParser::ParseSourceFunctionIds(CmdLineArgsParser *this)

{
  LPWSTR pWVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  pWVar1 = this->pszCurrentArg;
  if (*pWVar1 == L'+') {
    this->pszCurrentArg = pWVar1 + 1;
    uVar2 = 1;
LAB_003510e2:
    uVar4 = 0xffffffff;
  }
  else {
    if (*pWVar1 == L'*') {
      this->pszCurrentArg = pWVar1 + 1;
      uVar2 = 1;
    }
    else {
      uVar2 = ParseInteger(this);
      pWVar1 = this->pszCurrentArg;
      if (*pWVar1 != L'.') {
        uVar4 = (ulong)uVar2;
        uVar2 = 1;
        goto LAB_00351138;
      }
      this->pszCurrentArg = pWVar1 + 1;
      if (pWVar1[1] == L'+') {
        this->pszCurrentArg = pWVar1 + 2;
        goto LAB_003510e2;
      }
      if (pWVar1[1] != L'*') {
        uVar3 = ParseInteger(this);
        uVar4 = (ulong)uVar3;
        goto LAB_00351138;
      }
      this->pszCurrentArg = pWVar1 + 2;
    }
    uVar4 = 0xfffffffe;
  }
LAB_00351138:
  return (SourceFunctionNode)((ulong)uVar2 | uVar4 << 0x20);
}

Assistant:

Js::SourceFunctionNode
CmdLineArgsParser::ParseSourceFunctionIds()
{
    uint functionId, sourceId;

    if ('*' == CurChar())
    {
        sourceId = 1;
        functionId = (uint)-2;
        NextChar();
    }
    else if ('+' == CurChar())
    {
        sourceId = 1;
        functionId = (uint)-1;
        NextChar();
    }
    else
    {
        functionId = sourceId = ParseInteger();

        if ('.' == CurChar())
        {
            NextChar();
            if ('*' == CurChar())
            {
                functionId = (uint)-2;
                NextChar();
            }
            else if ('+' == CurChar())
            {
                functionId = (uint)-1;
                NextChar();
            }
            else
            {
                functionId = ParseInteger();
            }
        }
        else
        {
            sourceId = 1;
        }
    }
    return SourceFunctionNode(sourceId, functionId);
}